

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O0

aspa_status
aspa_table_update_in_place_undo
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update_operation *failed_operation)

{
  long lVar1;
  long in_FS_OFFSET;
  aspa_update_operation *op;
  size_t i;
  aspa_status res;
  aspa_update_operation *failed_operation_local;
  size_t count_local;
  aspa_update_operation *operations_local;
  rtr_socket *rtr_socket_local;
  aspa_table *aspa_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x37b,
                  "enum aspa_status aspa_table_update_in_place_undo(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x37c,
                  "enum aspa_status aspa_table_update_in_place_undo(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  if (((aspa_table == (aspa_table *)0x0) || (rtr_socket == (rtr_socket *)0x0)) ||
     ((count != 0 && (operations == (aspa_update_operation *)0x0)))) {
    aspa_table_local._4_4_ = ASPA_ERROR;
  }
  else if (count == 0) {
    aspa_table_local._4_4_ = ASPA_SUCCESS;
  }
  else {
    aspa_table_local._4_4_ =
         aspa_table_update_in_place_undo_internal
                   (aspa_table,rtr_socket,operations,count,failed_operation);
    for (op = (aspa_update_operation *)0x0; op < count;
        op = (aspa_update_operation *)((long)&op->index + 1)) {
      if (operations[(long)op].type == ASPA_REMOVE) {
        operations[(long)op].record.provider_asns = (uint32_t *)0x0;
        operations[(long)op].record.provider_count = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return aspa_table_local._4_4_;
}

Assistant:

enum aspa_status aspa_table_update_in_place_undo(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
						 struct aspa_update_operation *operations, size_t count,
						 struct aspa_update_operation *failed_operation)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);

	if (!aspa_table || !rtr_socket || ((count > 0) && !operations))
		return ASPA_ERROR;

	if (count == 0)
		return ASPA_SUCCESS;

	enum aspa_status res =
		aspa_table_update_in_place_undo_internal(aspa_table, rtr_socket, operations, count, failed_operation);

	for (size_t i = 0; i < count; i++) {
		struct aspa_update_operation *op = &operations[i];

		// If it's a remove operation, we inserted a reference to the removed record's providers.
		// Restore that 'remove' operation back to its original state.
		if (op->type == ASPA_REMOVE) {
			op->record.provider_asns = NULL;
			op->record.provider_count = 0;
		}
	}

	return res;
}